

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstar.cpp
# Opt level: O1

void __thiscall DSDcc::DSDDstar::processData(DSDDstar *this)

{
  uint uVar1;
  int iVar2;
  
  iVar2 = DSDSymbol::getDibit(&this->m_dsdDecoder->m_dsdSymbol);
  uVar1 = this->m_symbolIndex;
  if (uVar1 == 0) {
    this->nullBytes[0] = '\0';
    this->nullBytes[1] = '\0';
    this->nullBytes[2] = '\0';
    this->nullBytes[3] = '\0';
    this->slowdata[0] = '\0';
    this->slowdata[1] = '\0';
    this->slowdata[2] = '\0';
    this->slowdata[3] = '\0';
    this->slowdataIx = 0;
  }
  else if ((uVar1 & 7) == 0) {
    this->slowdataIx = this->slowdataIx + 1;
  }
  this->slowdata[this->slowdataIx] =
       this->slowdata[this->slowdataIx] + (char)(iVar2 << ((byte)uVar1 & 7));
  if (uVar1 == 0x17) {
    iVar2 = this->m_voiceFrameCount;
    if ((0 < iVar2) && (*(int *)this->slowdata != *(int *)this->nullBytes)) {
      this->slowdata[0] = this->slowdata[0] ^ 0x70;
      this->slowdata[1] = this->slowdata[1] ^ 0x4f;
      this->slowdata[2] = this->slowdata[2] ^ 0x93;
      processSlowData(this,iVar2 == 1);
    }
    this->m_frameType = DStarVoiceFrame;
    this->m_symbolIndex = 0;
  }
  else {
    this->m_symbolIndex = uVar1 + 1;
  }
  return;
}

Assistant:

void DSDDstar::processData()
{
    int bit = m_dsdDecoder->m_dsdSymbol.getDibit(); // get dibit from symbol

    if (m_symbolIndex == 0)
    {
        memset(slowdata, 0, 4);
        memset(nullBytes, 0, 4);
        slowdataIx = 0;
    }
    else if (m_symbolIndex%8 == 0)
    {
        slowdataIx++;
    }

    slowdata[slowdataIx] += bit<<(m_symbolIndex%8); // this is LSB first!

    if (m_symbolIndex == 24-1) // last bit in data frame
    {
//        std::cerr << "DSDDstar::processData: " << m_voiceFrameCount << std::endl;

        if ((m_voiceFrameCount > 0) && (memcmp(slowdata, nullBytes, 4) != 0))
        {
            slowdata[0] ^= 0x70;
            slowdata[1] ^= 0x4f;
            slowdata[2] ^= 0x93;
//            std::cerr << "DSDDstar::processData:"
//                    << " " << std::hex << (int) (slowdata[0])
//                    << " " << std::hex << (int) (slowdata[1])
//                    << " " << std::hex << (int) (slowdata[2])
//                    << " (" << m_voiceFrameCount << ")" << std::endl;
            processSlowData(m_voiceFrameCount == 1);
            //printf("unscrambled- %s",slowdata);
        }


        m_symbolIndex = 0;
        m_frameType = DStarVoiceFrame;
    }
    else
    {
        m_symbolIndex++;
    }
}